

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_dependencies.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DuckDBDependenciesBind
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[8]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [8])0x1dde6fe);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[6]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [6])0x1dde709);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [9])0x1dde712);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::INTEGER);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[11]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [11])"refclassid");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[9]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [9])"refobjid");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [12])"refobjsubid");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::INTEGER);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[8]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [8])"deptype");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> DuckDBDependenciesBind(ClientContext &context, TableFunctionBindInput &input,
                                                       vector<LogicalType> &return_types, vector<string> &names) {
	names.emplace_back("classid");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("objid");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("objsubid");
	return_types.emplace_back(LogicalType::INTEGER);

	names.emplace_back("refclassid");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("refobjid");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("refobjsubid");
	return_types.emplace_back(LogicalType::INTEGER);

	names.emplace_back("deptype");
	return_types.emplace_back(LogicalType::VARCHAR);

	return nullptr;
}